

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

bool slang::ast::CallExpression::bindArgs
               (ArgumentListSyntax *argSyntax,
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
               formalArgs,string_view symbolName,SourceRange range,ASTContext *context,
               SmallVectorBase<const_slang::ast::Expression_*> *boundArgs,bool isBuiltInMethod)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view *psVar1;
  bool bVar2;
  reference ppFVar3;
  ulong uVar4;
  reference ppSVar5;
  pointer ppVar6;
  size_type sVar7;
  reference ppVar8;
  SourceLocation SVar9;
  long in_RDI;
  SourceLocation in_R9;
  SourceRange SVar10;
  Token TVar11;
  string_view sVar12;
  byte in_stack_00000020;
  Diagnostic *diag_3;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
  *pair;
  iterator __end2_1;
  iterator __begin2_1;
  NamedArgMap *__range2_1;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  ExpressionSyntax *exSyn_1;
  PropertyExprSyntax *arg_1;
  iterator it_1;
  Diagnostic *diag;
  iterator it;
  ExpressionSyntax *exSyn;
  SyntaxNode *arg;
  Expression *expr;
  FormalArgumentSymbol *formal;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *__range2;
  uint32_t orderedIndex;
  bool bad;
  anon_class_16_2_d3173bde addDefaultDriver;
  NamedArgMap namedArgs;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Diagnostic *in_stack_fffffffffffff7d8;
  Diagnostic *in_stack_fffffffffffff7e0;
  SourceLocation in_stack_fffffffffffff7e8;
  Diagnostic *in_stack_fffffffffffff7f0;
  SourceLocation in_stack_fffffffffffff7f8;
  SourceLocation location;
  undefined4 in_stack_fffffffffffff800;
  DiagCode in_stack_fffffffffffff804;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  SyntaxNode *in_stack_fffffffffffff810;
  DiagCode DVar13;
  Diagnostic *in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  Diagnostic *in_stack_fffffffffffff838;
  anon_class_16_2_d3173bde *in_stack_fffffffffffff840;
  FormalArgumentSymbol *in_stack_fffffffffffff858;
  Type *in_stack_fffffffffffff868;
  ExpressionSyntax *in_stack_fffffffffffff870;
  Diagnostic *in_stack_fffffffffffff878;
  SourceLocation in_stack_fffffffffffff880;
  SourceLocation in_stack_fffffffffffff888;
  NamedArgMap *in_stack_fffffffffffff928;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> *in_stack_fffffffffffff930;
  ArgumentListSyntax *in_stack_fffffffffffff938;
  ASTContext *in_stack_fffffffffffff940;
  Token local_468;
  SourceLocation local_458;
  undefined4 local_44c;
  size_t local_448;
  char *pcStack_440;
  SourceLocation local_430;
  undefined4 local_424;
  Diagnostic *local_420;
  iterator local_418;
  char_pointer local_408;
  table_element_pointer local_400;
  underlying_type local_3f2;
  ExpressionSyntax *local_3f0;
  size_t local_3e8;
  char *pcStack_3e0;
  SourceRange local_3d8;
  undefined4 local_3c4;
  SyntaxNode *local_3c0;
  FormalArgumentSymbol *local_3b8;
  FormalArgumentSymbol *local_3b0;
  FormalArgumentSymbol **local_3a8;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_3a0;
  undefined1 *local_398;
  uint local_390;
  byte local_389;
  byte *local_388;
  SourceLocation local_380;
  undefined4 local_378;
  undefined1 local_260 [16];
  size_t local_250;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> local_220 [2];
  byte local_1d9;
  SourceLocation local_1d8;
  long local_1d0;
  undefined1 local_1b8 [23];
  byte local_1a1;
  string_view *local_1a0;
  undefined1 *local_198;
  char_pointer local_190;
  table_element_pointer local_188;
  string_view *local_180;
  undefined1 *local_178;
  char_pointer local_170;
  table_element_pointer local_168;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  local_160;
  string_view *local_148;
  undefined1 *local_140;
  iterator local_138;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
  local_128;
  string_view *local_110;
  undefined1 *local_108;
  iterator local_100;
  size_t local_f0;
  string_view *local_e8;
  undefined1 *local_e0;
  uint local_d4;
  value_type *local_d0;
  value_type *local_c8;
  uint local_bc;
  group_type *local_b8;
  size_t local_b0;
  pow2_quadratic_prober local_a8;
  size_t local_98;
  size_t local_90;
  string_view *local_88;
  undefined1 *local_80;
  size_t local_78;
  string_view *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  string_view *local_10;
  undefined1 *local_8;
  
  local_1d9 = in_stack_00000020 & 1;
  local_1d8 = in_R9;
  local_1d0 = in_RDI;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x803aec);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)in_stack_fffffffffffff7f0);
  if (local_1d0 != 0) {
    bVar2 = Expression::collectArgs
                      (in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930
                       ,in_stack_fffffffffffff928);
    TVar11.info = local_468.info;
    TVar11.kind = local_468.kind;
    TVar11._2_1_ = local_468._2_1_;
    TVar11.numFlags.raw = local_468.numFlags.raw;
    TVar11.rawLen = local_468.rawLen;
    if (!bVar2) {
      local_1a1 = 0;
      local_468 = TVar11;
      goto LAB_00804ff2;
    }
  }
  local_388 = &local_1d9;
  local_380 = local_1d8;
  local_389 = 0;
  local_390 = 0;
  local_398 = local_1b8;
  local_3a0._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffff7d8);
  local_3a8 = (FormalArgumentSymbol **)
              std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                          *)in_stack_fffffffffffff7e8);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff7e0,
                       (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff7d8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_3a0);
    local_3b0 = *ppFVar3;
    local_3b8 = (FormalArgumentSymbol *)0x0;
    uVar4 = (ulong)local_390;
    sVar7 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_220);
    if (uVar4 < sVar7) {
      uVar4 = (ulong)local_390;
      local_390 = local_390 + 1;
      ppSVar5 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::operator[](local_220,uVar4);
      local_3c0 = *ppSVar5;
      if (local_3c0->kind == EmptyArgument) {
        local_3b8 = (FormalArgumentSymbol *)
                    FormalArgumentSymbol::getDefaultValue(in_stack_fffffffffffff858);
        if (local_3b8 == (FormalArgumentSymbol *)0x0) {
          local_3c4 = 7;
          SVar10 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
          sourceRange.startLoc._4_2_ = in_stack_fffffffffffff804.subsystem;
          sourceRange.startLoc._6_2_ = in_stack_fffffffffffff804.code;
          sourceRange.startLoc._0_4_ = in_stack_fffffffffffff800;
          sourceRange.endLoc._0_7_ = in_stack_fffffffffffff808;
          sourceRange.endLoc._7_1_ = in_stack_fffffffffffff80f;
          local_3d8 = SVar10;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f8,
                              SUB84((ulong)in_stack_fffffffffffff810 >> 0x20,0),sourceRange);
          local_3e8 = (local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
          pcStack_3e0 = (local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str
          ;
          arg_00._M_str._0_7_ = in_stack_fffffffffffff830;
          arg_00._M_len = in_stack_fffffffffffff828;
          arg_00._M_str._7_1_ = in_stack_fffffffffffff837;
          Diagnostic::operator<<(in_stack_fffffffffffff820,arg_00);
        }
        else {
          bindArgs::anon_class_16_2_d3173bde::operator()
                    (in_stack_fffffffffffff840,(Expression *)in_stack_fffffffffffff838,
                     (FormalArgumentSymbol *)
                     CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
        }
      }
      else {
        slang::syntax::SyntaxNode::as<slang::syntax::PropertyExprSyntax>(local_3c0);
        local_3f0 = ASTContext::requireSimpleExpr
                              ((ASTContext *)in_stack_fffffffffffff7e0,
                               (PropertyExprSyntax *)in_stack_fffffffffffff7d8);
        if (local_3f0 != (ExpressionSyntax *)0x0) {
          ValueSymbol::getType((ValueSymbol *)0x803e58);
          local_3f2 = (local_3b0->super_VariableSymbol).flags.m_bits;
          local_3b8 = (FormalArgumentSymbol *)
                      Expression::bindArgument
                                ((Type *)in_stack_fffffffffffff880,
                                 (ArgumentDirection)((ulong)in_stack_fffffffffffff878 >> 0x20),
                                 (bitmask<slang::ast::VariableFlags>)in_stack_fffffffffffff888._6_2_
                                 ,in_stack_fffffffffffff870,(ASTContext *)in_stack_fffffffffffff868)
          ;
        }
      }
      local_180 = &(local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
      local_178 = local_260;
      local_148 = local_180;
      local_140 = local_260;
      local_70 = local_180;
      local_68 = local_260;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)in_stack_fffffffffffff7e0,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffff7d8);
      psVar1 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
      local_10 = psVar1;
      local_20 = local_78;
      local_8 = local_260;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)0x804015);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff7e8,(size_t)in_stack_fffffffffffff7e0);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)0x804077);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    *)0x8040ca);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                        *)0x8040fd);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff7f8,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff7f0);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
              ::table_locator(&local_160,local_40,local_5c,local_58 + local_5c);
              goto LAB_00804219;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
        if (bVar2) {
          memset(&local_160,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
          ::table_locator(&local_160);
          goto LAB_00804219;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_250);
      } while (bVar2);
      memset(&local_160,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
      ::table_locator(&local_160);
LAB_00804219:
      local_138 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::make_iterator((locator *)0x804228);
      local_170 = local_138.pc_;
      local_168 = local_138.p_;
      local_408 = local_138.pc_;
      local_400 = local_138.p_;
      local_418 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0x8042c5);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff7e0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff7d8);
      if (bVar2) {
        local_424 = 0x4a0007;
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffff7e0);
        local_430 = parsing::Token::location(&((ppVar6->second).first)->name);
        local_420 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f0,
                                        in_stack_fffffffffffff804,in_stack_fffffffffffff7f8);
        local_448 = (local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
        pcStack_440 = (local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
        arg_01._M_str._0_7_ = in_stack_fffffffffffff830;
        arg_01._M_len = in_stack_fffffffffffff828;
        arg_01._M_str._7_1_ = in_stack_fffffffffffff837;
        Diagnostic::operator<<(in_stack_fffffffffffff820,arg_01);
        local_44c = 0xc0001;
        TVar11 = slang::syntax::SyntaxNode::getFirstToken(in_stack_fffffffffffff810);
        local_468 = TVar11;
        local_458 = parsing::Token::location(&local_468);
        Diagnostic::addNote(in_stack_fffffffffffff7e0,
                            SUB84((ulong)in_stack_fffffffffffff7f0 >> 0x20,0),
                            in_stack_fffffffffffff7e8);
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffff7e0);
        (ppVar6->second).second = true;
        local_389 = 1;
      }
    }
    else {
      local_1a0 = &(local_3b0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
      local_198 = local_260;
      local_110 = local_1a0;
      local_108 = local_260;
      local_e8 = local_1a0;
      local_e0 = local_260;
      local_f0 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)in_stack_fffffffffffff7e0,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffff7d8);
      psVar1 = local_e8;
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
      local_88 = psVar1;
      local_98 = local_f0;
      local_80 = local_260;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_a8,local_90);
      do {
        local_b0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_a8);
        local_b8 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)0x8045cd);
        local_b8 = local_b8 + local_b0;
        local_bc = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff7e8,(size_t)in_stack_fffffffffffff7e0);
        if (local_bc != 0) {
          local_c8 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                     ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)0x80462f);
          local_d0 = local_c8 + local_b0 * 0xf;
          do {
            local_d4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                    *)0x804682);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>>
                      ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
                        *)0x8046b5);
            bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff7f8,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffff7f0);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
              ::table_locator(&local_128,local_b8,local_d4,local_d0 + local_d4);
              goto LAB_008047d1;
            }
            local_bc = local_bc - 1 & local_bc;
          } while (local_bc != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
        if (bVar2) {
          memset(&local_128,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
          ::table_locator(&local_128);
          goto LAB_008047d1;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_a8,local_250);
      } while (bVar2);
      memset(&local_128,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>_>
      ::table_locator(&local_128);
LAB_008047d1:
      local_100 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::make_iterator((locator *)0x8047e0);
      local_190 = local_100.pc_;
      local_188 = local_100.p_;
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)0x80487d);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff7e0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff7d8);
      if (bVar2) {
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffff7e0);
        (ppVar6->second).second = true;
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffff7e0);
        if (((ppVar6->second).first)->expr == (PropertyExprSyntax *)0x0) {
          local_3b8 = (FormalArgumentSymbol *)
                      FormalArgumentSymbol::getDefaultValue(in_stack_fffffffffffff858);
          if (local_3b8 == (FormalArgumentSymbol *)0x0) {
            in_stack_fffffffffffff880 = local_1d8;
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff7e0);
            SVar10 = slang::syntax::SyntaxNode::sourceRange
                               ((SyntaxNode *)
                                CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
            in_stack_fffffffffffff888 = SVar10.endLoc;
            SVar10.startLoc._4_2_ = in_stack_fffffffffffff804.subsystem;
            SVar10.startLoc._6_2_ = in_stack_fffffffffffff804.code;
            SVar10.startLoc._0_4_ = in_stack_fffffffffffff800;
            SVar10.endLoc._0_7_ = in_stack_fffffffffffff808;
            SVar10.endLoc._7_1_ = in_stack_fffffffffffff80f;
            in_stack_fffffffffffff878 =
                 ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f8,
                                     SUB84((ulong)in_stack_fffffffffffff810 >> 0x20,0),SVar10);
            arg_02._M_str._0_7_ = in_stack_fffffffffffff830;
            arg_02._M_len = in_stack_fffffffffffff828;
            arg_02._M_str._7_1_ = in_stack_fffffffffffff837;
            Diagnostic::operator<<(in_stack_fffffffffffff820,arg_02);
          }
          else {
            bindArgs::anon_class_16_2_d3173bde::operator()
                      (in_stack_fffffffffffff840,(Expression *)in_stack_fffffffffffff838,
                       (FormalArgumentSymbol *)
                       CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
          }
        }
        else {
          in_stack_fffffffffffff870 =
               ASTContext::requireSimpleExpr
                         ((ASTContext *)in_stack_fffffffffffff7e0,
                          (PropertyExprSyntax *)in_stack_fffffffffffff7d8);
          if (in_stack_fffffffffffff870 != (ExpressionSyntax *)0x0) {
            in_stack_fffffffffffff868 = ValueSymbol::getType((ValueSymbol *)0x804a61);
            local_3b8 = (FormalArgumentSymbol *)
                        Expression::bindArgument
                                  ((Type *)in_stack_fffffffffffff880,
                                   (ArgumentDirection)((ulong)in_stack_fffffffffffff878 >> 0x20),
                                   (bitmask<slang::ast::VariableFlags>)
                                   in_stack_fffffffffffff888._6_2_,in_stack_fffffffffffff870,
                                   (ASTContext *)in_stack_fffffffffffff868);
          }
        }
      }
      else {
        in_stack_fffffffffffff858 =
             (FormalArgumentSymbol *)
             FormalArgumentSymbol::getDefaultValue(in_stack_fffffffffffff858);
        local_3b8 = in_stack_fffffffffffff858;
        if (in_stack_fffffffffffff858 == (FormalArgumentSymbol *)0x0) {
          bVar2 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                           *)0x804b18);
          DVar13 = SUB84((ulong)in_stack_fffffffffffff810 >> 0x20,0);
          if (bVar2) {
            sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffff804.subsystem;
            sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffff804.code;
            sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffff800;
            sourceRange_00.endLoc._0_7_ = in_stack_fffffffffffff808;
            sourceRange_00.endLoc._7_1_ = in_stack_fffffffffffff80f;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f8,DVar13,sourceRange_00);
            arg_03._M_str._0_7_ = in_stack_fffffffffffff830;
            arg_03._M_len = in_stack_fffffffffffff828;
            arg_03._M_str._7_1_ = in_stack_fffffffffffff837;
            Diagnostic::operator<<(in_stack_fffffffffffff820,arg_03);
            std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                        *)0x804bc0);
            Diagnostic::operator<<<unsigned_long>
                      (in_stack_fffffffffffff7f0,(unsigned_long)in_stack_fffffffffffff7e8);
            SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_220);
            Diagnostic::operator<<<unsigned_long>
                      (in_stack_fffffffffffff7f0,(unsigned_long)in_stack_fffffffffffff7e8);
            local_389 = 1;
            break;
          }
          sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffff804.subsystem;
          sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffff804.code;
          sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffff800;
          sourceRange_01.endLoc._0_7_ = in_stack_fffffffffffff808;
          sourceRange_01.endLoc._7_1_ = in_stack_fffffffffffff80f;
          in_stack_fffffffffffff838 =
               ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f8,DVar13,sourceRange_01);
          arg_04._M_str._0_7_ = in_stack_fffffffffffff830;
          arg_04._M_len = in_stack_fffffffffffff828;
          arg_04._M_str._7_1_ = in_stack_fffffffffffff837;
          Diagnostic::operator<<(in_stack_fffffffffffff820,arg_04);
        }
        else {
          bindArgs::anon_class_16_2_d3173bde::operator()
                    (in_stack_fffffffffffff840,(Expression *)in_stack_fffffffffffff838,
                     (FormalArgumentSymbol *)
                     CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
        }
      }
    }
    if (local_3b8 == (FormalArgumentSymbol *)0x0) {
      local_389 = 1;
    }
    else {
      in_stack_fffffffffffff837 = Expression::bad((Expression *)in_stack_fffffffffffff7e0);
      local_389 = local_389 & 1 | in_stack_fffffffffffff837;
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff7e0,
                 (Expression **)in_stack_fffffffffffff7d8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_3a0);
  }
  DVar13 = SUB84((ulong)in_stack_fffffffffffff810 >> 0x20,0);
  uVar4 = (ulong)local_390;
  sVar7 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_220);
  if (uVar4 < sVar7) {
    sourceRange_02.startLoc._4_2_ = in_stack_fffffffffffff804.subsystem;
    sourceRange_02.startLoc._6_2_ = in_stack_fffffffffffff804.code;
    sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffff800;
    sourceRange_02.endLoc._0_7_ = in_stack_fffffffffffff808;
    sourceRange_02.endLoc._7_1_ = in_stack_fffffffffffff80f;
    in_stack_fffffffffffff820 =
         ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f8,DVar13,sourceRange_02);
    arg_05._M_str._0_7_ = in_stack_fffffffffffff830;
    arg_05._M_len = uVar4;
    arg_05._M_str._7_1_ = in_stack_fffffffffffff837;
    Diagnostic::operator<<(in_stack_fffffffffffff820,arg_05);
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
              ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
               0x804dd3);
    Diagnostic::operator<<<unsigned_long>
              (in_stack_fffffffffffff7f0,(unsigned_long)in_stack_fffffffffffff7e8);
    SmallVectorBase<const_slang::syntax::SyntaxNode_*>::size(local_220);
    Diagnostic::operator<<<unsigned_long>
              (in_stack_fffffffffffff7f0,(unsigned_long)in_stack_fffffffffffff7e8);
    local_389 = 1;
  }
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
           *)0x804e37);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
         *)0x804e5b);
  sVar12._M_str = (char *)in_stack_fffffffffffff7e0;
  sVar12._M_len = (size_t)in_stack_fffffffffffff7e8;
  while( true ) {
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)sVar12._M_str,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff7d8);
    if (!bVar2) break;
    ppVar8 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)0x804ea0);
    if (((ppVar8->second).second & 1U) == 0) {
      location = local_1d8;
      SVar9 = parsing::Token::location(&((ppVar8->second).first)->name);
      in_stack_fffffffffffff7d8 =
           ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff7f0,SVar9._4_4_,location);
      in_stack_fffffffffffff7f0 = in_stack_fffffffffffff7d8;
      sVar12 = parsing::Token::valueText((Token *)in_stack_fffffffffffff7d8);
      arg_06._M_str._0_7_ = in_stack_fffffffffffff830;
      arg_06._M_len = uVar4;
      arg_06._M_str._7_1_ = in_stack_fffffffffffff837;
      Diagnostic::operator<<(in_stack_fffffffffffff820,arg_06);
      arg_07._M_str._0_7_ = in_stack_fffffffffffff830;
      arg_07._M_len = uVar4;
      arg_07._M_str._7_1_ = in_stack_fffffffffffff837;
      Diagnostic::operator<<(in_stack_fffffffffffff820,arg_07);
      local_389 = 1;
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  *)sVar12._M_str);
  }
  local_1a1 = (local_389 ^ 0xff) & 1;
LAB_00804ff2:
  local_378 = 1;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
               *)0x804fff);
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x80500c);
  return (bool)(local_1a1 & 1);
}

Assistant:

bool CallExpression::bindArgs(const ArgumentListSyntax* argSyntax,
                              std::span<const FormalArgumentSymbol* const> formalArgs,
                              std::string_view symbolName, SourceRange range,
                              const ASTContext& context,
                              SmallVectorBase<const Expression*>& boundArgs, bool isBuiltInMethod) {
    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (argSyntax) {
        if (!collectArgs(context, *argSyntax, orderedArgs, namedArgs))
            return false;
    }

    // Helper function to register a driver for default value arguments.
    auto addDefaultDriver = [&](const Expression& expr, const FormalArgumentSymbol& formal) {
        if (isBuiltInMethod)
            return;

        switch (formal.direction) {
            case ArgumentDirection::In:
                // Nothing to do for inputs.
                break;
            case ArgumentDirection::Out:
            case ArgumentDirection::InOut:
                // The default value binding should always use bindLValue() which
                // will always return either an AssignmentExpression or a bad expr.
                SLANG_ASSERT(expr.kind == ExpressionKind::Assignment || expr.bad());
                if (expr.kind == ExpressionKind::Assignment)
                    expr.as<AssignmentExpression>().left().requireLValue(context);
                break;
            case ArgumentDirection::Ref:
                if (!formal.flags.has(VariableFlags::Const))
                    expr.requireLValue(context);
                break;
        }
    };

    bool bad = false;
    uint32_t orderedIndex = 0;
    for (auto formal : formalArgs) {
        const Expression* expr = nullptr;
        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr)
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
                else
                    addDefaultDriver(*expr, *formal);
            }
            else if (auto exSyn = context.requireSimpleExpr(arg->as<PropertyExprSyntax>())) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            auto arg = it->second.first->expr;
            if (!arg) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
                else {
                    addDefaultDriver(*expr, *formal);
                }
            }
            else if (auto exSyn = context.requireSimpleExpr(*arg)) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }
        }
        else {
            expr = formal->getDefaultValue();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbolName;
                    diag << formalArgs.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
            else {
                addDefaultDriver(*expr, *formal);
            }
        }

        if (!expr) {
            bad = true;
        }
        else {
            bad |= expr->bad();
            boundArgs.push_back(expr);
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbolName;
        diag << formalArgs.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (const auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbolName;
            bad = true;
        }
    }

    return !bad;
}